

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::~ColladaExporter(ColladaExporter *this)

{
  ColladaExporter *this_local;
  
  ~ColladaExporter(this);
  operator_delete(this);
  return;
}

Assistant:

ColladaExporter::~ColladaExporter() {
    if ( mSceneOwned ) {
        delete mScene;
    }
}